

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.cpp
# Opt level: O0

int __thiscall
jbcoin::verify(jbcoin *this,STObject *st,HashPrefix *prefix,PublicKey *pk,SF_Blob *sigField)

{
  bool bVar1;
  uint32_t i;
  int iVar2;
  void *data;
  size_t sVar3;
  pointer_const_type pSVar4;
  uint8_t *data_00;
  undefined8 extraout_RAX;
  Slice local_98;
  Slice local_88 [2];
  undefined1 local_68 [8];
  Serializer ss;
  undefined1 local_48 [8];
  optional<jbcoin::Slice> sig;
  SF_Blob *sigField_local;
  PublicKey *pk_local;
  HashPrefix *prefix_local;
  STObject *st_local;
  
  sig.super_type.m_storage.dummy_._8_8_ = pk;
  get<jbcoin::STBlob>((optional<jbcoin::Slice> *)local_48,(STObject *)this,
                      (TypedField<jbcoin::STBlob> *)pk);
  bVar1 = boost::optional<jbcoin::Slice>::operator!((optional<jbcoin::Slice> *)local_48);
  if (bVar1) {
    st_local._7_1_ = 0;
    ss.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    Serializer::Serializer((Serializer *)local_68,0x100);
    i = HashPrefix::operator_cast_to_unsigned_int((HashPrefix *)st);
    Serializer::add32((Serializer *)local_68,i);
    STObject::addWithoutSigningFields((STObject *)this,(Serializer *)local_68);
    data = Serializer::data((Serializer *)local_68);
    sVar3 = Serializer::size((Serializer *)local_68);
    Slice::Slice(local_88,data,sVar3);
    pSVar4 = boost::optional<jbcoin::Slice>::operator->((optional<jbcoin::Slice> *)local_48);
    data_00 = Slice::data(pSVar4);
    pSVar4 = boost::optional<jbcoin::Slice>::operator->((optional<jbcoin::Slice> *)local_48);
    sVar3 = Slice::size(pSVar4);
    Slice::Slice(&local_98,data_00,sVar3);
    iVar2 = verify((EVP_PKEY_CTX *)prefix,(uchar *)local_88,(size_t)&local_98,(uchar *)0x1,
                   (size_t)sigField);
    st_local._7_1_ = (byte)iVar2 & 1;
    ss.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    Serializer::~Serializer((Serializer *)local_68);
  }
  boost::optional<jbcoin::Slice>::~optional((optional<jbcoin::Slice> *)local_48);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),st_local._7_1_);
}

Assistant:

bool
verify (STObject const& st, HashPrefix const& prefix,
    PublicKey const& pk, SF_Blob const& sigField)
{
    auto const sig = get(st, sigField);
    if (! sig)
        return false;
    Serializer ss;
    ss.add32(prefix);
    st.addWithoutSigningFields(ss);
    return verify(pk,
        Slice(ss.data(), ss.size()),
            Slice(sig->data(), sig->size()));
}